

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

void __thiscall clip_ctx::~clip_ctx(clip_ctx *this)

{
  clip_vision_model *in_RDI;
  vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *unaff_retaddr;
  
  ggml_backend_free(in_RDI[1].patch_embeddings_0);
  if (in_RDI[1].patch_embeddings_0 != in_RDI[1].patch_embeddings_1) {
    ggml_backend_free(in_RDI[1].patch_embeddings_1);
  }
  std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::~unique_ptr
            ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)in_RDI);
  std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>::~unique_ptr
            ((unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)unaff_retaddr);
  std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>::~vector
            ((vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_> *)
             unaff_retaddr);
  std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::~vector(unaff_retaddr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)unaff_retaddr);
  std::unique_ptr<ggml_context,_ggml_context_deleter>::~unique_ptr
            ((unique_ptr<ggml_context,_ggml_context_deleter> *)unaff_retaddr);
  std::unique_ptr<gguf_context,_gguf_context_deleter>::~unique_ptr
            ((unique_ptr<gguf_context,_gguf_context_deleter> *)unaff_retaddr);
  clip_vision_model::~clip_vision_model(in_RDI);
  return;
}

Assistant:

~clip_ctx() {
        ggml_backend_free(backend);
        if (backend != backend_cpu) {
            ggml_backend_free(backend_cpu);
        }
    }